

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  FILE *pFVar10;
  void *pvVar11;
  long lVar12;
  void *pvVar13;
  char *pcVar14;
  xmlTextReaderPtr reader;
  undefined4 uVar15;
  undefined1 *puVar16;
  int iVar17;
  uint uVar18;
  int in_R9D;
  ulong uVar19;
  ulong uVar20;
  glob_t globbuf;
  char prefix [500];
  char result [500];
  char err [500];
  char pattern [500];
  int iStack_19d8;
  glob64_t gStack_19c0;
  undefined4 uStack_1978;
  undefined4 uStack_1974;
  short sStack_1970;
  char acStack_1778 [499];
  undefined1 uStack_1585;
  char acStack_1578 [499];
  undefined1 uStack_1385;
  char acStack_1378 [499];
  undefined1 uStack_1185;
  long lStack_1180;
  undefined8 uStack_1178;
  ulong uStack_1170;
  long lStack_1168;
  ulong uStack_1160;
  code *pcStack_1158;
  char *pcStack_1148;
  char *pcStack_1140;
  long lStack_1138;
  undefined4 uStack_112c;
  ulong uStack_1128;
  long lStack_1120;
  glob64_t gStack_1118;
  char acStack_10d0 [499];
  undefined1 uStack_edd;
  undefined1 auStack_ed0 [512];
  char acStack_cd0 [499];
  undefined1 uStack_add;
  char acStack_ad0 [499];
  undefined1 uStack_8dd;
  long lStack_8d8;
  ulong uStack_8d0;
  ulong uStack_8c8;
  long lStack_8c0;
  undefined8 uStack_8b8;
  code *pcStack_8b0;
  char *local_8a0;
  char *local_898;
  long local_890;
  int local_884;
  ulong local_880;
  long local_878;
  glob64_t local_870;
  undefined1 local_828 [512];
  char local_628 [499];
  undefined1 local_435;
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcStack_8b0 = (code *)0x108e14;
  local_884 = options;
  pcVar5 = baseFilename(filename);
  pcStack_8b0 = (code *)0x108e24;
  local_898 = filename;
  uVar6 = xmlSchemaNewParserCtxt(filename);
  pcStack_8b0 = (code *)0x108e3c;
  xmlSchemaSetParserErrors(uVar6,testErrorHandler,testErrorHandler,uVar6);
  pcStack_8b0 = (code *)0x108e44;
  local_890 = xmlSchemaParse(uVar6);
  pcStack_8b0 = (code *)0x108e51;
  xmlSchemaFreeParserCtxt(uVar6);
  iVar4 = testErrorsSize;
  pcStack_8b0 = (code *)0x108e5f;
  sVar7 = strlen(pcVar5);
  iVar3 = (int)sVar7;
  iVar17 = -1;
  if (0xfffffe10 < iVar3 - 500U) {
    iVar17 = iVar3 + -6;
    if (pcVar5[(long)iVar3 + -6] != '_') {
      iVar17 = iVar3 + -4;
    }
    if (pcVar5[(long)iVar17 + -2] == '_') {
      iVar17 = iVar17 + -2;
    }
    sVar7 = (size_t)iVar17;
    pcStack_8b0 = (code *)0x108eb1;
    memcpy(local_828,pcVar5,sVar7);
    local_828[sVar7] = 0;
    pcStack_8b0 = (code *)0x108ed8;
    iVar3 = snprintf(local_228,499,"./test/schemas/%s_*.xml",local_828);
    if (0x1f2 < iVar3) {
      local_35 = 0;
    }
    if (pcVar5[sVar7] == '_') {
      pcStack_8b0 = (code *)0x108f02;
      memcpy(local_828,pcVar5,sVar7 + 2);
      local_828[sVar7 + 2] = 0;
    }
    local_870.gl_offs = 0;
    uVar20 = 0;
    pcStack_8b0 = (code *)0x108f32;
    glob64(local_228,8,(__errfunc *)0x0,&local_870);
    if (local_870.gl_pathc != 0) {
      local_878 = (long)iVar4;
      uVar19 = 0;
      uVar20 = 0;
      lVar12 = local_890;
      do {
        testErrorsSize = (int)local_878;
        testErrors[local_878] = '\0';
        local_8a0 = local_870.gl_pathv[uVar19];
        pcStack_8b0 = (code *)0x108f7e;
        pcVar5 = baseFilename(local_8a0);
        pcStack_8b0 = (code *)0x108f89;
        sVar7 = strlen(pcVar5);
        iVar3 = (int)sVar7;
        if ((iVar3 < 7) || (pcVar5[iVar3 - 6] != '_')) {
          pcStack_8b0 = (code *)0x109187;
          fprintf(_stderr,"don\'t know how to process %s\n",local_8a0);
        }
        else {
          cVar1 = pcVar5[iVar3 - 5];
          pcStack_8b0 = (code *)0x108fcf;
          iVar3 = snprintf(local_628,499,"result/schemas/%s_%c",local_828,(ulong)(uint)(int)cVar1);
          if (0x1f2 < iVar3) {
            local_435 = 0;
          }
          puVar16 = local_828;
          pcStack_8b0 = (code *)0x109004;
          iVar3 = snprintf(local_428,499,"result/schemas/%s_%c.err",puVar16,(ulong)(uint)(int)cVar1)
          ;
          uVar15 = SUB84(puVar16,0);
          if (0x1f2 < iVar3) {
            local_235 = 0;
          }
          if (lVar12 != 0) {
            nb_tests = nb_tests + 1;
            pcStack_8b0 = (code *)0x109032;
            lVar8 = xmlReadFile(local_8a0,0,local_884);
            if (lVar8 == 0) {
              pcStack_8b0 = (code *)0x1091d5;
              fprintf(_stderr,"failed to parse instance %s for %s\n",local_8a0,local_898);
              uVar18 = 0xffffffff;
            }
            else {
              pcVar5 = local_628;
              pcStack_8b0 = (code *)0x10905e;
              local_880 = uVar20;
              pcVar9 = resultFilename(pcVar5,temp_directory,".res");
              if (pcVar9 == (char *)0x0) {
                pcStack_8b0 = rngTest;
                schemasTest_cold_2();
                pcStack_8b0 = (code *)testErrors;
                uStack_8b8 = 0xfffffffa;
                pcStack_1158 = (code *)0x10926b;
                uStack_112c = uVar15;
                lStack_8d8 = lVar8;
                uStack_8d0 = uVar19;
                uStack_8c8 = uVar20;
                lStack_8c0 = lVar12;
                pcVar9 = baseFilename(pcVar5);
                pcStack_1158 = (code *)0x10927b;
                pcStack_1140 = pcVar5;
                pvVar11 = (void *)xmlRelaxNGNewParserCtxt(pcVar5);
                pcStack_1158 = (code *)0x109293;
                xmlRelaxNGSetParserErrors(pvVar11,testErrorHandler,testErrorHandler,pvVar11);
                pcStack_1158 = (code *)0x10929b;
                lVar12 = xmlRelaxNGParse(pvVar11);
                pcStack_1158 = (code *)0x1092a6;
                xmlRelaxNGFreeParserCtxt();
                lStack_1138 = lVar12;
                if (lVar12 == 0) {
                  pcStack_1158 = (code *)0x1092c3;
                  testErrorHandler(pvVar11,"Relax-NG schema %s failed to compile\n",pcStack_1140);
                }
                iVar3 = testErrorsSize;
                pcStack_1158 = (code *)0x1092d1;
                sVar7 = strlen(pcVar9);
                iVar4 = -1;
                if ((int)sVar7 - 500U < 0xfffffe11) goto LAB_00109652;
                uVar20 = (ulong)((int)sVar7 - 4);
                pcStack_1158 = (code *)0x109304;
                memcpy(auStack_ed0,pcVar9,uVar20);
                auStack_ed0[uVar20] = 0;
                uVar20 = 0;
                pcStack_1158 = (code *)0x10932e;
                iVar4 = snprintf(acStack_ad0,499,"./test/relaxng/%s_?.xml",auStack_ed0);
                if (0x1f2 < iVar4) {
                  uStack_8dd = 0;
                }
                gStack_1118.gl_offs = 0;
                pcStack_1158 = (code *)0x109361;
                glob64(acStack_ad0,8,(__errfunc *)0x0,&gStack_1118);
                if (gStack_1118.gl_pathc == 0) goto LAB_00109648;
                lVar12 = (long)iVar3;
                uVar19 = 0;
                uVar20 = 0;
                lStack_1120 = lVar12;
                goto LAB_00109386;
              }
              pcStack_8b0 = (code *)0x109079;
              pFVar10 = fopen64(pcVar9,"wb");
              if (pFVar10 == (FILE *)0x0) {
                pcStack_8b0 = (code *)0x1091ea;
                schemasTest_cold_1();
                uVar18 = 0xffffffff;
                uVar20 = local_880;
              }
              else {
                pcStack_8b0 = (code *)0x10908d;
                uVar6 = xmlSchemaNewValidCtxt(lVar12);
                pcStack_8b0 = (code *)0x1090a5;
                xmlSchemaSetValidErrors(uVar6,testErrorHandler,testErrorHandler,uVar6);
                pcStack_8b0 = (code *)0x1090b0;
                iVar3 = xmlSchemaValidateDoc(uVar6,lVar8);
                pcVar5 = "%s validation generated an internal error\n";
                if (0 < iVar3) {
                  pcVar5 = "%s fails to validate\n";
                }
                if (iVar3 == 0) {
                  pcVar5 = "%s validates\n";
                }
                pcStack_8b0 = (code *)0x1090e0;
                fprintf(pFVar10,pcVar5,local_8a0);
                pcStack_8b0 = (code *)0x1090e8;
                fclose(pFVar10);
                pcStack_8b0 = (code *)0x1090f8;
                iVar3 = compareFiles(pcVar9,local_628);
                if (iVar3 != 0) {
                  pcStack_8b0 = (code *)0x109216;
                  fprintf(_stderr,"Result for %s on %s failed\n",local_8a0,local_898);
                }
                uVar18 = (uint)(iVar3 != 0);
                pcStack_8b0 = (code *)0x109108;
                unlink(pcVar9);
                pcStack_8b0 = (code *)0x109110;
                free(pcVar9);
                pcStack_8b0 = (code *)0x109118;
                xmlSchemaFreeValidCtxt(uVar6);
                pcStack_8b0 = (code *)0x109120;
                xmlFreeDoc(lVar8);
                uVar20 = local_880;
                lVar12 = local_890;
              }
            }
            uVar20 = uVar20 & 0xffffffff;
            if (uVar18 != 0) {
              uVar20 = (ulong)uVar18;
            }
          }
          pcStack_8b0 = (code *)0x109153;
          iVar3 = compareFileMem(local_428,testErrors,testErrorsSize);
          if (iVar3 != 0) {
            pcStack_8b0 = (code *)0x1091ab;
            fprintf(_stderr,"Error for %s on %s failed\n",local_8a0,local_898);
            uVar20 = 1;
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < local_870.gl_pathc);
    }
    iVar17 = (int)uVar20;
    pcStack_8b0 = (code *)0x10922a;
    globfree64(&local_870);
  }
  pcStack_8b0 = (code *)0x109234;
  xmlSchemaFree(local_890);
  return iVar17;
LAB_00109386:
  testErrorsSize = (int)lVar12;
  testErrors[lVar12] = '\0';
  pcStack_1148 = gStack_1118.gl_pathv[uVar19];
  pcStack_1158 = (code *)0x1093a5;
  pcVar5 = baseFilename(pcStack_1148);
  pcStack_1158 = (code *)0x1093b0;
  sVar7 = strlen(pcVar5);
  iVar3 = (int)sVar7;
  if ((iVar3 < 7) || (pcVar5[iVar3 - 6] != '_')) {
    pcStack_1158 = (code *)0x1095b0;
    fprintf(_stderr,"don\'t know how to process %s\n",pcStack_1148);
  }
  else {
    cVar1 = pcVar5[iVar3 - 5];
    pcStack_1158 = (code *)0x1093f6;
    iVar3 = snprintf(acStack_10d0,499,"result/relaxng/%s_%c",auStack_ed0,(ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar3) {
      uStack_edd = 0;
    }
    puVar16 = auStack_ed0;
    pcStack_1158 = (code *)0x10942b;
    iVar3 = snprintf(acStack_cd0,499,"result/relaxng/%s_%c.err",puVar16,(ulong)(uint)(int)cVar1);
    uVar15 = SUB84(puVar16,0);
    if (0x1f2 < iVar3) {
      uStack_add = 0;
    }
    if (lStack_1138 != 0) {
      nb_tests = nb_tests + 1;
      pcStack_1158 = (code *)0x10945c;
      lVar8 = xmlReadFile(pcStack_1148,0,uStack_112c);
      if (lVar8 == 0) {
        pcStack_1158 = (code *)0x1095f8;
        fprintf(_stderr,"failed to parse instance %s for %s\n",pcStack_1148,pcStack_1140);
        uVar18 = 0xffffffff;
      }
      else {
        pcVar5 = acStack_10d0;
        pcStack_1158 = (code *)0x109488;
        uStack_1128 = uVar20;
        pcVar9 = resultFilename(pcVar5,temp_directory,".res");
        if (pcVar9 == (char *)0x0) {
          pcStack_1158 = rngStreamTest;
          rngTest_cold_2();
          pcStack_1158 = (code *)testErrors;
          uStack_1178 = 0xfffffffa;
          lStack_1180 = lVar8;
          uStack_1170 = uVar20;
          lStack_1168 = lVar12;
          uStack_1160 = uVar19;
          pcVar9 = baseFilename(pcVar5);
          sVar7 = strlen(pcVar9);
          if ((int)sVar7 - 500U < 0xfffffe11) {
            fprintf(_stderr,"len(base) == %d !\n",sVar7 & 0xffffffff);
            return -1;
          }
          uVar20 = (ulong)((int)sVar7 - 4);
          memcpy(&uStack_1978,pcVar9,uVar20);
          *(undefined1 *)((long)&uStack_1978 + uVar20) = 0;
          if (((sStack_1970 == 0x31 && CONCAT44(uStack_1974,uStack_1978) == 0x5f3031726f747574) ||
              (sStack_1970 == 0x32 && CONCAT44(uStack_1974,uStack_1978) == 0x5f3031726f747574)) ||
             ((char)sStack_1970 == '\0' && CONCAT44(uStack_1974,uStack_1978) == 0x325f33726f747574))
          {
LAB_00109751:
            bVar2 = true;
          }
          else {
            if ((CONCAT31((undefined3)uStack_1974,uStack_1978._3_1_) == 0x373733 &&
                 uStack_1978 == 0x33373033) ||
               ((char)sStack_1970 == '\0' && CONCAT44(uStack_1974,uStack_1978) == 0x325f38726f747574
               )) goto LAB_00109751;
            bVar2 = false;
          }
          iStack_19d8 = 0;
          iVar3 = snprintf(acStack_1578,499,"./test/relaxng/%s_?.xml",&uStack_1978);
          if (0x1f2 < iVar3) {
            uStack_1385 = 0;
          }
          gStack_19c0.gl_offs = 0;
          glob64(acStack_1578,8,(__errfunc *)0x0,&gStack_19c0);
          if (gStack_19c0.gl_pathc == 0) goto LAB_00109939;
          uVar20 = 0;
          iStack_19d8 = 0;
          goto LAB_001097dc;
        }
        pcStack_1158 = (code *)0x1094a3;
        pFVar10 = fopen64(pcVar9,"wb");
        if (pFVar10 == (FILE *)0x0) {
          pcStack_1158 = (code *)0x10960d;
          rngTest_cold_1();
          uVar18 = 0xffffffff;
          uVar20 = uStack_1128;
        }
        else {
          pcStack_1158 = (code *)0x1094b9;
          pvVar13 = (void *)xmlRelaxNGNewValidCtxt(lStack_1138);
          pcStack_1158 = (code *)0x1094d1;
          xmlRelaxNGSetValidErrors(pvVar13,testErrorHandler,testErrorHandler,pvVar13);
          pcStack_1158 = (code *)0x1094dc;
          pvVar11 = pvVar13;
          iVar3 = xmlRelaxNGValidateDoc(pvVar13,lVar8);
          pcVar5 = "%s validation generated an internal error\n";
          if (0 < iVar3) {
            pcVar5 = "%s fails to validate\n";
          }
          if (iVar3 == 0) {
            pcVar5 = "%s validates\n";
          }
          pcStack_1158 = (code *)0x109509;
          testErrorHandler(pvVar11,pcVar5,pcStack_1148);
          pcStack_1158 = (code *)0x109511;
          fclose(pFVar10);
          pcStack_1158 = (code *)0x109521;
          iVar3 = compareFiles(pcVar9,acStack_10d0);
          if (iVar3 != 0) {
            pcStack_1158 = (code *)0x10963e;
            fprintf(_stderr,"Result for %s on %s failed\n",pcStack_1148,pcStack_1140);
          }
          uVar18 = (uint)(iVar3 != 0);
          pcStack_1158 = (code *)0x109531;
          unlink(pcVar9);
          pcStack_1158 = (code *)0x109539;
          free(pcVar9);
          pcStack_1158 = (code *)0x109541;
          xmlRelaxNGFreeValidCtxt(pvVar13);
          pcStack_1158 = (code *)0x109549;
          xmlFreeDoc(lVar8);
          uVar20 = uStack_1128;
          lVar12 = lStack_1120;
        }
      }
      uVar20 = uVar20 & 0xffffffff;
      if (uVar18 != 0) {
        uVar20 = (ulong)uVar18;
      }
    }
    pcStack_1158 = (code *)0x10957c;
    iVar3 = compareFileMem(acStack_cd0,testErrors,testErrorsSize);
    if (iVar3 != 0) {
      pcStack_1158 = (code *)0x1095d4;
      fprintf(_stderr,"Error for %s on %s failed\n",pcStack_1148,pcStack_1140);
    }
  }
  uVar19 = uVar19 + 1;
  if (gStack_1118.gl_pathc <= uVar19) {
LAB_00109648:
    iVar4 = (int)uVar20;
    pcStack_1158 = (code *)0x109652;
    globfree64(&gStack_1118);
LAB_00109652:
    pcStack_1158 = (code *)0x10965c;
    xmlRelaxNGFree(lStack_1138);
    return iVar4;
  }
  goto LAB_00109386;
LAB_001097dc:
  testErrorsSize = 0;
  testErrors[0] = '\0';
  pcVar9 = gStack_19c0.gl_pathv[uVar20];
  pcVar14 = baseFilename(pcVar9);
  sVar7 = strlen(pcVar14);
  iVar3 = (int)sVar7;
  if ((iVar3 < 7) || (pcVar14[iVar3 - 6] != '_')) {
    pcVar14 = "don\'t know how to process %s\n";
LAB_00109923:
    fprintf(_stderr,pcVar14,pcVar9);
  }
  else {
    cVar1 = pcVar14[iVar3 - 5];
    iVar3 = snprintf(acStack_1378,499,"result/relaxng/%s_%c",&uStack_1978,(ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar3) {
      uStack_1185 = 0;
    }
    iVar3 = snprintf(acStack_1778,499,"result/relaxng/%s_%c.err",&uStack_1978,
                     (ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar3) {
      uStack_1585 = 0;
    }
    reader = (xmlTextReaderPtr)xmlReaderForFile(pcVar9,0,uVar15);
    if (reader == (xmlTextReaderPtr)0x0) {
      fprintf(_stderr,"Failed to build reader for %s\n",pcVar9);
    }
    if (bVar2) {
      pcVar14 = (char *)0x0;
    }
    else {
      pcVar14 = acStack_1778;
    }
    iVar3 = streamProcessTest(pcVar9,acStack_1378,pcVar14,reader,pcVar5,in_R9D);
    xmlFreeTextReader(reader);
    if (iVar3 != 0) {
      iStack_19d8 = -1;
      pcVar14 = "instance %s failed\n";
      goto LAB_00109923;
    }
  }
  uVar20 = uVar20 + 1;
  if (gStack_19c0.gl_pathc <= uVar20) {
LAB_00109939:
    globfree64(&gStack_19c0);
    return iStack_19d8;
  }
  goto LAB_001097dc;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_*.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/schemas/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas != NULL) {
	    nb_tests++;
	    ret = schemasOneTest(filename, instance, result, options, schemas);
	    if (ret != 0)
		res = ret;
	}
        if (compareFileMem(err, testErrors, testErrorsSize)) {
            fprintf(stderr, "Error for %s on %s failed\n", instance,
                    filename);
            res = 1;
        }
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}